

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O0

int erkStep_Init(void *arkode_mem,int init_type)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  N_Vector p_Var4;
  int in_ESI;
  int j;
  int retval;
  ARKodeERKStepMem step_mem;
  ARKodeMem ark_mem;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar5;
  undefined4 in_stack_ffffffffffffffd4;
  ARKodeMem in_stack_ffffffffffffffd8;
  ARKodeMem local_20;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  local_4 = erkStep_AccessStepMem
                      (in_stack_ffffffffffffffd8,
                       (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       (ARKodeMem *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                       (ARKodeERKStepMem *)0x1143168);
  if (local_4 == 0) {
    if ((in_ESI == 2) || (in_ESI == 1)) {
      local_4 = 0;
    }
    else {
      if ((local_20->fixedstep != 0) && (local_20->user_efun == 0)) {
        local_20->user_efun = 0;
        local_20->efun = arkEwtSetSmallReal;
        local_20->e_data = local_20;
      }
      iVar1 = erkStep_SetButcherTable((ARKodeMem)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
      if (iVar1 == 0) {
        iVar1 = erkStep_CheckButcherTable((ARKodeMem)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
        if (iVar1 == 0) {
          iVar5 = *(int *)in_stack_ffffffffffffffd8->reltol;
          local_20->hadapt_mem->q = iVar5;
          *(int *)&in_stack_ffffffffffffffd8->user_data = iVar5;
          iVar5 = *(int *)((long)in_stack_ffffffffffffffd8->reltol + 4);
          local_20->hadapt_mem->p = iVar5;
          *(int *)((long)&in_stack_ffffffffffffffd8->user_data + 4) = iVar5;
          if ((local_20->fixedstep == 0) &&
             (*(int *)((long)&in_stack_ffffffffffffffd8->user_data + 4) == 0)) {
            arkProcessError(local_20,-0x16,"ARKode::ERKStep","erkStep_Init",
                            "Adaptive timestepping cannot be performed without embedding coefficients"
                           );
            local_4 = -0x16;
          }
          else {
            if (in_stack_ffffffffffffffd8->uround == 0.0) {
              pvVar3 = calloc((long)in_stack_ffffffffffffffd8->itol,8);
              in_stack_ffffffffffffffd8->uround = (realtype)pvVar3;
            }
            for (iVar5 = 0; iVar5 < in_stack_ffffffffffffffd8->itol; iVar5 = iVar5 + 1) {
              iVar2 = arkAllocVec(in_stack_ffffffffffffffd8,(N_Vector)CONCAT44(iVar1,iVar5),
                                  (N_Vector *)
                                  CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
              if (iVar2 == 0) {
                return -0x14;
              }
            }
            local_20->liw = (long)in_stack_ffffffffffffffd8->itol + local_20->liw;
            if (in_stack_ffffffffffffffd8->Vabstol == (N_Vector)0x0) {
              p_Var4 = (N_Vector)calloc((long)(in_stack_ffffffffffffffd8->itol + 1),8);
              in_stack_ffffffffffffffd8->Vabstol = p_Var4;
              if (in_stack_ffffffffffffffd8->Vabstol == (N_Vector)0x0) {
                return -0x14;
              }
              local_20->lrw = (long)(in_stack_ffffffffffffffd8->itol + 1) + local_20->lrw;
            }
            if (*(long *)&in_stack_ffffffffffffffd8->atolmin0 == 0) {
              pvVar3 = calloc((long)(in_stack_ffffffffffffffd8->itol + 1),8);
              *(void **)&in_stack_ffffffffffffffd8->atolmin0 = pvVar3;
              if (*(long *)&in_stack_ffffffffffffffd8->atolmin0 == 0) {
                return -0x14;
              }
              local_20->liw = (long)(in_stack_ffffffffffffffd8->itol + 1) + local_20->liw;
            }
            if ((local_20->interp == (ARKInterp)0x0) ||
               (iVar1 = arkInterpSetDegree(in_stack_ffffffffffffffd8,
                                           (ARKInterp)CONCAT44(iVar1,iVar5),
                                           in_stack_ffffffffffffffcc), iVar1 == 0)) {
              local_20->call_fullrhs = 1;
              local_4 = 0;
            }
            else {
              arkProcessError(local_20,-0x16,"ARKode::ERKStep","erkStep_Init",
                              "Unable to update interpolation polynomial degree");
              local_4 = -0x16;
            }
          }
        }
        else {
          arkProcessError(local_20,-0x16,"ARKode::ERKStep","erkStep_Init","Error in Butcher table");
          local_4 = -0x16;
        }
      }
      else {
        arkProcessError(local_20,-0x16,"ARKode::ERKStep","erkStep_Init",
                        "Could not create Butcher table");
        local_4 = -0x16;
      }
    }
  }
  return local_4;
}

Assistant:

int erkStep_Init(void* arkode_mem, int init_type)
{
  ARKodeMem ark_mem;
  ARKodeERKStepMem step_mem;
  int retval, j;

  /* access ARKodeERKStepMem structure */
  retval = erkStep_AccessStepMem(arkode_mem, "erkStep_Init",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* immediately return if resize or reset */
  if (init_type == RESIZE_INIT || init_type == RESET_INIT)
    return(ARK_SUCCESS);

  /* enforce use of arkEwtSmallReal if using a fixed step size
     and an internal error weight function */
  if ( ark_mem->fixedstep && !ark_mem->user_efun ) {
    ark_mem->user_efun = SUNFALSE;
    ark_mem->efun      = arkEwtSetSmallReal;
    ark_mem->e_data    = ark_mem;
  }

  /* Create Butcher table (if not already set) */
  retval = erkStep_SetButcherTable(ark_mem);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ERKStep", "erkStep_Init",
                    "Could not create Butcher table");
    return(ARK_ILL_INPUT);
  }

  /* Check that Butcher table are OK */
  retval = erkStep_CheckButcherTable(ark_mem);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ERKStep",
                    "erkStep_Init", "Error in Butcher table");
    return(ARK_ILL_INPUT);
  }

  /* Retrieve/store method and embedding orders now that table is finalized */
  step_mem->q = ark_mem->hadapt_mem->q = step_mem->B->q;
  step_mem->p = ark_mem->hadapt_mem->p = step_mem->B->p;

  /* Ensure that if adaptivity is enabled, then method includes embedding coefficients */
  if (!ark_mem->fixedstep && (step_mem->p == 0)) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ERKStep", "erkStep_Init",
                    "Adaptive timestepping cannot be performed without embedding coefficients");
    return(ARK_ILL_INPUT);
  }

  /* Allocate ARK RHS vector memory, update storage requirements */
  /*   Allocate F[0] ... F[stages-1] if needed */
  if (step_mem->F == NULL)
    step_mem->F = (N_Vector *) calloc(step_mem->stages, sizeof(N_Vector));
  for (j=0; j<step_mem->stages; j++) {
    if (!arkAllocVec(ark_mem, ark_mem->ewt, &(step_mem->F[j])))
      return(ARK_MEM_FAIL);
  }
  ark_mem->liw += step_mem->stages;  /* pointers */

  /* Allocate reusable arrays for fused vector interface */
  if (step_mem->cvals == NULL) {
    step_mem->cvals = (realtype *) calloc(step_mem->stages+1, sizeof(realtype));
    if (step_mem->cvals == NULL)  return(ARK_MEM_FAIL);
    ark_mem->lrw += (step_mem->stages + 1);
  }
  if (step_mem->Xvecs == NULL) {
    step_mem->Xvecs = (N_Vector *) calloc(step_mem->stages+1, sizeof(N_Vector));
    if (step_mem->Xvecs == NULL)  return(ARK_MEM_FAIL);
    ark_mem->liw += (step_mem->stages + 1);   /* pointers */
  }

  /* Limit interpolant degree based on method order (use negative
     argument to specify update instead of overwrite) */
  if (ark_mem->interp != NULL) {
    retval = arkInterpSetDegree(ark_mem, ark_mem->interp, -(step_mem->q-1));
    if (retval != ARK_SUCCESS) {
      arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode::ERKStep", "erkStep_Init",
                      "Unable to update interpolation polynomial degree");
      return(ARK_ILL_INPUT);
    }
  }

  /* Signal to shared arkode module that fullrhs is required after each step */
  ark_mem->call_fullrhs = SUNTRUE;

  return(ARK_SUCCESS);
}